

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_1.c
# Opt level: O0

void another_function(void)

{
  FILE *__stream;
  int local_24;
  int i;
  FILE *fp;
  stop_t *stops;
  int stops_count;
  
  stops._4_4_ = 0;
  __stream = fopen("../tests/data/google_sample/stops.txt","r");
  if (__stream != (FILE *)0x0) {
    stops._4_4_ = read_all_stops((FILE *)__stream,(stop_t **)&fp);
    fclose(__stream);
  }
  for (local_24 = 0; local_24 < stops._4_4_; local_24 = local_24 + 1) {
    do_stuff_with_stop((stop_t *)((long)fp + (long)local_24 * 0x3b0));
  }
  if (0 < stops._4_4_) {
    free(fp);
  }
  return;
}

Assistant:

void another_function(void) {
    int stops_count = 0;
    stop_t *stops;

    // It's 100% up to the developer to ensure
    // that the correct file is passed
    // to the parsing functions.
    FILE *fp = fopen("../tests/data/google_sample/stops.txt", "r");
    if (fp) {
        // The function allocates all the required memory.
        stops_count = read_all_stops(fp, &stops);
        fclose(fp);
    }

    for (int i = 0; i < stops_count; i++)
        do_stuff_with_stop(&(stops[i]));

    if (stops_count > 0)
        free(stops);
}